

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ac3Codec.cpp
# Opt level: O2

string * __thiscall
AC3Codec::getStreamInfo_abi_cxx11_(string *__return_storage_ptr__,AC3Codec *this)

{
  byte bVar1;
  ostream *poVar2;
  uint uVar3;
  char *pcVar4;
  string hd_type;
  ostringstream str;
  undefined1 *local_1a8;
  undefined8 local_1a0;
  undefined1 local_198 [16];
  ostringstream local_188 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  local_1a8 = local_198;
  local_1a0 = 0;
  local_198[0] = 0;
  std::__cxx11::string::assign((char *)&local_1a8);
  if (this->m_true_hd_mode == true) {
    if (10 < this->m_bsid) {
      std::operator<<((ostream *)local_188,"E");
    }
    std::operator<<((ostream *)local_188,"AC3 core + ");
    std::operator<<((ostream *)local_188,(string *)&local_1a8);
    if ((this->mlp).m_substreams == '\x04') {
      std::operator<<((ostream *)local_188," + ATMOS");
    }
    std::operator<<((ostream *)local_188,". ");
    poVar2 = std::operator<<((ostream *)local_188,"Peak bitrate: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->mlp).m_bitrate / 1000);
    poVar2 = std::operator<<(poVar2,"Kbps (core ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_bit_rate / 1000);
    std::operator<<(poVar2,"Kbps) ");
    poVar2 = std::operator<<((ostream *)local_188,"Sample Rate: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->mlp).m_samplerate / 1000);
    std::operator<<(poVar2,"KHz ");
    if (this->m_sample_rate == (this->mlp).m_samplerate) goto LAB_0018d109;
    poVar2 = std::operator<<((ostream *)local_188," (core ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_sample_rate / 1000);
    pcVar4 = "Khz) ";
  }
  else {
    if (10 < this->m_bsid) {
      std::operator<<((ostream *)local_188,"EAC3 ");
    }
    if (this->m_isAtmos == true) {
      std::operator<<((ostream *)local_188,"+ ATMOS, ");
    }
    poVar2 = std::operator<<((ostream *)local_188,"Bitrate: ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<(poVar2,"Kbps ");
    if (this->m_bit_rateExt != 0) {
      poVar2 = std::operator<<((ostream *)local_188,"(core ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_bit_rate / 1000);
      std::operator<<(poVar2,"Kbps) ");
    }
    poVar2 = std::operator<<((ostream *)local_188,"Sample Rate: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_sample_rate / 1000);
    pcVar4 = "KHz ";
  }
  std::operator<<(poVar2,pcVar4);
LAB_0018d109:
  std::operator<<((ostream *)local_188,"Channels: ");
  uVar3 = this->m_channels + 2;
  if (this->m_extChannelsExists == false) {
    uVar3 = (uint)this->m_channels;
  }
  bVar1 = (this->mlp).m_channels;
  if (bVar1 != 0) {
    uVar3 = (uint)bVar1;
  }
  if (this->m_lfeon == '\0') {
    std::ostream::operator<<((ostream *)local_188,uVar3);
  }
  else {
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_188,uVar3 - 1);
    std::operator<<(poVar2,".1");
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return __return_storage_ptr__;
}

Assistant:

const std::string AC3Codec::getStreamInfo()
{
    std::ostringstream str;
    std::string hd_type;
    if (mlp.m_subType == MlpSubType::stTRUEHD)
        hd_type = "TRUE-HD";
    else
        hd_type = (mlp.m_subType == MlpSubType::stMLP) ? "MLP" : "UNKNOWN";

    if (m_true_hd_mode)
    {
        if (isEAC3())
            str << "E";
        str << "AC3 core + ";
        str << hd_type;
        if (mlp.m_substreams == 4)
            str << " + ATMOS";
        str << ". ";

        str << "Peak bitrate: " << mlp.m_bitrate / 1000 << "Kbps (core " << m_bit_rate / 1000 << "Kbps) ";
        str << "Sample Rate: " << mlp.m_samplerate / 1000 << "KHz ";
        if (m_sample_rate != mlp.m_samplerate)
            str << " (core " << m_sample_rate / 1000 << "Khz) ";
    }
    else
    {
        if (isEAC3())
            str << "EAC3 ";
        if (m_isAtmos)
            str << "+ ATMOS, ";

        str << "Bitrate: " << (m_bit_rate + m_bit_rateExt) / 1000 << "Kbps ";
        if (m_bit_rateExt)
            str << "(core " << m_bit_rate / 1000 << "Kbps) ";
        str << "Sample Rate: " << m_sample_rate / 1000 << "KHz ";
    }

    str << "Channels: ";
    int channels = m_channels;
    if (m_extChannelsExists)
        channels += 2;
    if (mlp.m_channels)
        channels = mlp.m_channels;

    if (m_lfeon)
        str << channels - 1 << ".1";
    else
        str << channels;
    return str.str();
}